

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tank.cpp
# Opt level: O0

double __thiscall Tank::findVolume(Tank *this,double aHead)

{
  double *pdVar1;
  double local_50;
  double local_48 [2];
  double ucfArea;
  double intercept;
  double slope;
  double depth;
  double aHead_local;
  Tank *this_local;
  
  slope = aHead - (this->super_Node).elev;
  depth = aHead;
  aHead_local = (double)this;
  if (this->volCurve == (Curve *)0x0) {
    if (0.0 < this->minVolume) {
      local_48[0] = aHead - this->minHead;
      local_50 = 0.0;
      pdVar1 = std::max<double>(local_48,&local_50);
      slope = *pdVar1;
    }
    this_local = (Tank *)(this->area * slope + this->minVolume);
  }
  else {
    slope = this->ucfLength * slope;
    Curve::findSegment(this->volCurve,slope,&intercept,&ucfArea);
    this_local = (Tank *)((intercept * slope + ucfArea) /
                         (this->ucfLength * this->ucfLength * this->ucfLength));
  }
  return (double)this_local;
}

Assistant:

double Tank::findVolume(double aHead)
{
    // ... convert head to water depth

    double depth = aHead - elev;

    // ... tank has a volume curve (in original user units)

    if ( volCurve )
    {
        // ... find slope and intercept of curve segment containing depth

        depth *= ucfLength;
        double slope, intercept;
        volCurve->findSegment(depth, slope, intercept);

        // ... compute volume and convert to ft3

        double ucfArea = ucfLength * ucfLength;
        return (slope * depth + intercept) / (ucfArea * ucfLength);
    }

    // ... tank is cylindrical

    if ( minVolume > 0.0 ) depth = max(aHead - minHead, 0.0);
    return minVolume + area * depth;
}